

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_connection::connect_failed(peer_connection *this,error_code *e)

{
  undefined1 *puVar1;
  int *piVar2;
  _Atomic_word *p_Var3;
  int iVar4;
  session_interface *psVar5;
  torrent_peer *ptVar6;
  session_settings *psVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bt_peer_connection *this_00;
  undefined4 extraout_var_01;
  long *plVar12;
  endpoint *ep;
  error_code *ec;
  endpoint *ep_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar13;
  element_type *this_02;
  bool bVar14;
  string local_78;
  string local_58;
  io_context *local_38;
  char local_30 [4];
  uint local_2c;
  
  iVar11 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
             _vptr_session_logger[5])();
  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar11) + 0x68) < 0) {
    print_endpoint_abi_cxx11_(&local_78,(aux *)&this->m_remote,ep);
    _Var9._M_p = local_78._M_dataplus._M_p;
    print_error_abi_cxx11_(&local_58,(libtorrent *)e,ec);
    peer_log(this,info,"CONNECTION FAILED","%s %s",_Var9._M_p,local_58._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  iVar11 = (**(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
              _vptr_session_logger)();
  if ((char)iVar11 != '\0') {
    psVar5 = (this->super_peer_connection_hot_members).m_ses;
    print_endpoint_abi_cxx11_(&local_78,(aux *)&this->m_remote,ep_00);
    (*(psVar5->super_session_logger)._vptr_session_logger[1])
              (psVar5,"CONNECTION FAILED: %s",local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  counters::inc_stats_counter(this->m_counters,0x2b,1);
  this_01 = (this->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar11 = this_01->_M_use_count;
    do {
      if (iVar11 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar4 = this_01->_M_use_count;
      bVar14 = iVar11 == iVar4;
      if (bVar14) {
        this_01->_M_use_count = iVar11 + 1;
        iVar4 = iVar11;
      }
      iVar11 = iVar4;
      UNLOCK();
    } while (!bVar14);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar14 = true;
  }
  else {
    bVar14 = this_01->_M_use_count == 0;
  }
  if (bVar14) {
    this_02 = (torrent *)0x0;
  }
  else {
    this_02 = (this->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe5,-1);
    if (((this_02 != (torrent *)0x0) && (ptVar6 = this->m_peer_info, ptVar6 != (torrent_peer *)0x0))
       && (this_02->m_num_connecting = this_02->m_num_connecting - 1,
          (ptVar6->field_0x1b & 0x80) != 0)) {
      this_02->m_num_connecting_seeds = this_02->m_num_connecting_seeds - 1;
    }
    puVar1 = &(this->super_peer_connection_hot_members).field_0x28;
    *puVar1 = *puVar1 & 0xfd;
  }
  bVar14 = is_utp(&this->m_socket);
  if (((bVar14) && (ptVar6 = this->m_peer_info, ptVar6 != (torrent_peer *)0x0)) &&
     (((*(uint *)&ptVar6->field_0x1b >> 0x1c & 1) != 0 && ((this->field_0x886 & 0x40) == 0)))) {
    *(uint *)&ptVar6->field_0x1b = *(uint *)&ptVar6->field_0x1b & 0xefffffff;
    fast_reconnect(this,true);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,e,0x10,0);
    if ((this_02 != (torrent *)0x0) && (this->m_peer_info != (torrent_peer *)0x0)) {
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_weak_count = this_01->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_weak_count = this_01->_M_weak_count + 1;
        }
      }
      ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::peer_connection,void>
                ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                 &local_78,
                 (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
      sVar10 = local_78._M_string_length;
      if ((scheduler_operation *)local_78._M_string_length != (scheduler_operation *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar1 = (undefined1 *)((long)(local_78._M_string_length + 8) + 4);
          *(int *)puVar1 = *(int *)puVar1 + 1;
          UNLOCK();
        }
        else {
          puVar1 = (undefined1 *)((long)(local_78._M_string_length + 8) + 4);
          *(int *)puVar1 = *(int *)puVar1 + 1;
        }
      }
      if ((scheduler_operation *)local_78._M_string_length != (scheduler_operation *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
      }
      local_38 = this->m_ios;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_weak_count = this_01->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_weak_count = this_01->_M_weak_count + 1;
        }
      }
      local_78.field_2._M_allocated_capacity = (size_type)local_78._M_dataplus._M_p;
      local_78.field_2._8_8_ = local_78._M_string_length;
      if ((scheduler_operation *)local_78._M_string_length != (scheduler_operation *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar1 = (undefined1 *)((long)(local_78._M_string_length + 8) + 4);
          *(int *)puVar1 = *(int *)puVar1 + 1;
          UNLOCK();
        }
        else {
          puVar1 = (undefined1 *)((long)(local_78._M_string_length + 8) + 4);
          *(int *)puVar1 = *(int *)puVar1 + 1;
        }
      }
      local_58._M_dataplus._M_p = local_30;
      local_2c = 1;
      local_78._M_dataplus._M_p = (pointer)this_02;
      local_78._M_string_length = (size_type)this_01;
      plVar12 = (long *)__tls_get_addr(&PTR_004faf08);
      if (*plVar12 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = *(undefined8 *)(*plVar12 + 8);
      }
      local_58._M_string_length =
           (size_type)
           boost::asio::detail::thread_info_base::
           allocate<boost::asio::detail::thread_info_base::default_tag>(uVar13,0x40);
      ((operation *)local_58._M_string_length)->next_ = (scheduler_operation *)0x0;
      ((operation *)local_58._M_string_length)->func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:4194:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      ((operation *)local_58._M_string_length)->task_result_ = 0;
      ((operation *)(local_58._M_string_length + 0x18))->next_ =
           (scheduler_operation *)local_78._M_dataplus._M_p;
      ((operation *)(local_58._M_string_length + 0x18))->func_ =
           (func_type)local_78._M_string_length;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      *(size_type *)&((operation *)(local_58._M_string_length + 0x18))->task_result_ =
           local_78.field_2._M_allocated_capacity;
      ((operation *)(local_58._M_string_length + 0x30))->next_ =
           (scheduler_operation *)local_78.field_2._8_8_;
      local_78.field_2._M_allocated_capacity = 0;
      local_78.field_2._8_8_ = (long *)0x0;
      local_58.field_2._M_allocated_capacity = local_58._M_string_length;
      boost::asio::detail::scheduler::post_immediate_completion
                (local_38->impl_,(operation *)local_58._M_string_length,SUB41((local_2c & 2) >> 1,0)
                );
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:4194:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset((ptr *)&local_58);
      if ((long *)local_78.field_2._8_8_ != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)(local_78.field_2._8_8_ + 0xc);
          iVar11 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar11 = *(int *)(local_78.field_2._8_8_ + 0xc);
          *(int *)(local_78.field_2._8_8_ + 0xc) = iVar11 + -1;
        }
        if (iVar11 == 1) {
          (**(code **)(*(long *)local_78.field_2._8_8_ + 0x18))();
        }
      }
      if ((scheduler_operation *)local_78._M_string_length != (scheduler_operation *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar1 = (undefined1 *)((long)(local_78._M_string_length + 8) + 4);
          iVar11 = *(int *)puVar1;
          *(int *)puVar1 = *(int *)puVar1 + -1;
          UNLOCK();
        }
        else {
          iVar11 = *(int *)((long)(local_78._M_string_length + 8) + 4);
          *(int *)((long)(local_78._M_string_length + 8) + 4) = iVar11 + -1;
        }
        if (iVar11 == 1) {
          (*(code *)(*(scheduler_operation **)local_78._M_string_length)[1].next_)();
        }
      }
      if ((scheduler_operation *)sVar10 != (scheduler_operation *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          puVar1 = (undefined1 *)((long)(sVar10 + 8) + 4);
          iVar11 = *(int *)puVar1;
          *(int *)puVar1 = *(int *)puVar1 + -1;
          UNLOCK();
        }
        else {
          iVar11 = *(int *)((long)(sVar10 + 8) + 4);
          *(int *)((long)(sVar10 + 8) + 4) = iVar11 + -1;
        }
        if (iVar11 == 1) {
          (*(code *)(*(scheduler_operation **)sVar10)[1].next_)(sVar10);
        }
      }
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3 = &this_01->_M_weak_count;
        iVar11 = *p_Var3;
        *p_Var3 = *p_Var3 + -1;
        UNLOCK();
      }
      else {
        iVar11 = this_01->_M_weak_count;
        this_01->_M_weak_count = iVar11 + -1;
      }
      if (iVar11 == 1) {
        (*this_01->_vptr__Sp_counted_base[3])(this_01);
      }
    }
    goto LAB_0024c86a;
  }
  if ((this->field_0x886 & 0x40) != 0) {
    fast_reconnect(this,true);
  }
  bVar14 = is_utp(&this->m_socket);
  if (bVar14) {
    psVar7 = (this->super_peer_connection_hot_members).m_settings;
    local_78._M_dataplus._M_p = (pointer)&psVar7->m_mutex;
    local_78._M_string_length = local_78._M_string_length & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_78);
    local_78._M_string_length = CONCAT71(local_78._M_string_length._1_7_,1);
    uVar8 = (psVar7->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_78);
    if ((uVar8 >> 0x22 & 1) == 0) goto LAB_0024c7fb;
  }
  else {
LAB_0024c7fb:
    if (((this->m_peer_info != (torrent_peer *)0x0) && ((this->m_peer_info->field_0x1e & 0x40) != 0)
        ) && ((this->field_0x886 & 0x40) == 0)) {
      iVar11 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(this);
      this_00 = torrent::find_introducer(this_02,(endpoint *)CONCAT44(extraout_var_00,iVar11));
      if (this_00 != (bt_peer_connection *)0x0) {
        iVar11 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(this);
        bt_peer_connection::write_holepunch_msg
                  (this_00,rendezvous,(endpoint *)CONCAT44(extraout_var_01,iVar11),no_error);
      }
    }
  }
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,e,0x10,1);
LAB_0024c86a:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void peer_connection::connect_failed(error_code const& e)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(e);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "CONNECTION FAILED"
				, "%s %s", print_endpoint(m_remote).c_str(), print_error(e).c_str());
		}
#endif
#ifndef TORRENT_DISABLE_LOGGING
		if (m_ses.should_log())
			m_ses.session_log("CONNECTION FAILED: %s", print_endpoint(m_remote).c_str());
#endif

		m_counters.inc_stats_counter(counters::connect_timeouts);

		auto t = m_torrent.lock();
		TORRENT_ASSERT(!m_connecting || t);
		if (m_connecting)
		{
			m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
			if (t && m_peer_info) t->dec_num_connecting(m_peer_info);
			m_connecting = false;
		}

		// a connection attempt using uTP just failed
		// mark this peer as not supporting uTP
		// we'll never try it again (unless we're trying holepunch)
		if (is_utp(m_socket)
			&& m_peer_info
			&& m_peer_info->supports_utp
			&& !m_holepunch_mode)
		{
			m_peer_info->supports_utp = false;
			// reconnect immediately using TCP
			fast_reconnect(true);
			disconnect(e, operation_t::connect, normal);
			if (t && m_peer_info)
			{
				std::weak_ptr<aux::torrent> weak_t = t;
				std::weak_ptr<peer_connection> weak_self = shared_from_this();

				// we can't touch m_connections here, since we're likely looping
				// over it. So defer the actual reconnection to after we've handled
				// the existing message queue
				post(m_ios, [weak_t, weak_self]()
				{
					auto tor = weak_t.lock();
					std::shared_ptr<peer_connection> p = weak_self.lock();
					if (tor && p)
					{
						aux::torrent_peer* pi = p->peer_info_struct();
						tor->connect_to_peer(pi, true);
					}
				});
			}
			return;
		}

		if (m_holepunch_mode)
			fast_reconnect(true);

#ifndef TORRENT_DISABLE_EXTENSIONS
		if ((!is_utp(m_socket)
				|| !m_settings.get_bool(settings_pack::enable_outgoing_tcp))
			&& m_peer_info
			&& m_peer_info->supports_holepunch
			&& !m_holepunch_mode)
		{
			// see if we can try a holepunch
			aux::bt_peer_connection* p = t->find_introducer(remote());
			if (p)
				p->write_holepunch_msg(aux::bt_peer_connection::hp_message::rendezvous, remote());
		}
#endif

		disconnect(e, operation_t::connect, failure);
	}